

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Bag.h
# Opt level: O1

void __thiscall
slang::Bag::set<slang::parsing::PreprocessorOptions&>(Bag *this,PreprocessorOptions *item)

{
  long lVar1;
  group_type_pointer pgVar2;
  pointer_____offset_0x10___ __s1;
  pointer_____offset_0x10___ __s2;
  uint uVar3;
  undefined1 auVar4 [16];
  int iVar5;
  size_t sVar6;
  uint uVar7;
  value_type_pointer ppVar8;
  value_type_pointer ppVar9;
  group_type_pointer pgVar10;
  ulong uVar11;
  type_index tVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  bool bVar19;
  undefined1 auVar20 [16];
  uchar uVar21;
  uchar uVar22;
  uchar uVar23;
  uchar uVar24;
  uchar uVar25;
  uchar uVar26;
  uchar uVar27;
  uchar uVar28;
  uchar uVar29;
  uchar uVar30;
  uchar uVar31;
  uchar uVar32;
  uchar uVar33;
  uchar uVar34;
  uchar uVar35;
  uchar uVar36;
  locator res;
  try_emplace_args_t local_b9;
  type_index local_b8;
  ulong local_b0;
  ulong local_a8;
  table_core<boost::unordered::detail::foa::flat_map_types<std::type_index,std::any>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::type_index,void>,std::equal_to<std::type_index>,std::allocator<std::pair<std::type_index_const,std::any>>>
  *local_a0;
  PreprocessorOptions *local_98;
  ulong local_90;
  ulong local_88;
  size_t local_80;
  ulong local_78;
  type_info *local_70;
  value_type_pointer local_68;
  group_type_pointer local_60;
  uchar local_58;
  uchar uStack_57;
  uchar uStack_56;
  uchar uStack_55;
  uchar uStack_54;
  uchar uStack_53;
  uchar uStack_52;
  uchar uStack_51;
  uchar uStack_50;
  uchar uStack_4f;
  uchar uStack_4e;
  uchar uStack_4d;
  uchar uStack_4c;
  uchar uStack_4b;
  uchar uStack_4a;
  uchar uStack_49;
  locator local_48;
  
  local_b8._M_target = (type_info *)&parsing::PreprocessorOptions::typeinfo;
  sVar6 = std::type_info::hash_code((type_info *)&parsing::PreprocessorOptions::typeinfo);
  auVar4._8_8_ = 0;
  auVar4._0_8_ = sVar6;
  uVar16 = SUB168(auVar4 * ZEXT816(0x9e3779b97f4a7c15),8) ^
           SUB168(auVar4 * ZEXT816(0x9e3779b97f4a7c15),0);
  uVar14 = uVar16 >> ((byte)(this->items).table_.
                            super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::type_index,_std::any>,_slang::hash<std::type_index>,_std::equal_to<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::any>_>_>
                            .arrays.groups_size_index & 0x3f);
  pgVar10 = (this->items).table_.
            super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::type_index,_std::any>,_slang::hash<std::type_index>,_std::equal_to<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::any>_>_>
            .arrays.groups_;
  lVar1 = (uVar16 & 0xff) * 4;
  uVar21 = (&UNK_0051f39c)[lVar1];
  uVar22 = (&UNK_0051f39d)[lVar1];
  uVar23 = (&UNK_0051f39e)[lVar1];
  uVar24 = (&UNK_0051f39f)[lVar1];
  uVar13 = (ulong)((uint)uVar16 & 7);
  sVar6 = (this->items).table_.
          super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::type_index,_std::any>,_slang::hash<std::type_index>,_std::equal_to<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::any>_>_>
          .arrays.groups_size_mask;
  uVar18 = 0;
  ppVar8 = (this->items).table_.
           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::type_index,_std::any>,_slang::hash<std::type_index>,_std::equal_to<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::any>_>_>
           .arrays.elements_;
  tVar12._M_target = local_b8._M_target;
  uVar15 = uVar14;
  uVar25 = uVar21;
  uVar26 = uVar22;
  uVar27 = uVar23;
  uVar28 = uVar24;
  uVar29 = uVar21;
  uVar30 = uVar22;
  uVar31 = uVar23;
  uVar32 = uVar24;
  uVar33 = uVar21;
  uVar34 = uVar22;
  uVar35 = uVar23;
  uVar36 = uVar24;
  do {
    pgVar2 = pgVar10 + uVar14;
    auVar20[0] = -(pgVar2->m[0].n == uVar21);
    auVar20[1] = -(pgVar2->m[1].n == uVar22);
    auVar20[2] = -(pgVar2->m[2].n == uVar23);
    auVar20[3] = -(pgVar2->m[3].n == uVar24);
    auVar20[4] = -(pgVar2->m[4].n == uVar25);
    auVar20[5] = -(pgVar2->m[5].n == uVar26);
    auVar20[6] = -(pgVar2->m[6].n == uVar27);
    auVar20[7] = -(pgVar2->m[7].n == uVar28);
    auVar20[8] = -(pgVar2->m[8].n == uVar29);
    auVar20[9] = -(pgVar2->m[9].n == uVar30);
    auVar20[10] = -(pgVar2->m[10].n == uVar31);
    auVar20[0xb] = -(pgVar2->m[0xb].n == uVar32);
    auVar20[0xc] = -(pgVar2->m[0xc].n == uVar33);
    auVar20[0xd] = -(pgVar2->m[0xd].n == uVar34);
    auVar20[0xe] = -(pgVar2->m[0xe].n == uVar35);
    auVar20[0xf] = -(pgVar2->m[0xf].n == uVar36);
    uVar7 = (uint)(ushort)((ushort)(SUB161(auVar20 >> 7,0) & 1) |
                           (ushort)(SUB161(auVar20 >> 0xf,0) & 1) << 1 |
                           (ushort)(SUB161(auVar20 >> 0x17,0) & 1) << 2 |
                           (ushort)(SUB161(auVar20 >> 0x1f,0) & 1) << 3 |
                           (ushort)(SUB161(auVar20 >> 0x27,0) & 1) << 4 |
                           (ushort)(SUB161(auVar20 >> 0x2f,0) & 1) << 5 |
                           (ushort)(SUB161(auVar20 >> 0x37,0) & 1) << 6 |
                           (ushort)(SUB161(auVar20 >> 0x3f,0) & 1) << 7 |
                           (ushort)(SUB161(auVar20 >> 0x47,0) & 1) << 8 |
                           (ushort)(SUB161(auVar20 >> 0x4f,0) & 1) << 9 |
                           (ushort)(SUB161(auVar20 >> 0x57,0) & 1) << 10 |
                           (ushort)(SUB161(auVar20 >> 0x5f,0) & 1) << 0xb |
                           (ushort)(SUB161(auVar20 >> 0x67,0) & 1) << 0xc |
                           (ushort)(SUB161(auVar20 >> 0x6f,0) & 1) << 0xd |
                          (ushort)(SUB161(auVar20 >> 0x77,0) & 1) << 0xe);
    ppVar9 = ppVar8;
    uVar11 = uVar14;
    uVar17 = uVar18;
    if (uVar7 != 0) {
      __s1 = *(pointer_____offset_0x10___ *)(tVar12._M_target + 8);
      local_b0 = uVar15;
      local_a8 = uVar16;
      local_a0 = (table_core<boost::unordered::detail::foa::flat_map_types<std::type_index,std::any>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::type_index,void>,std::equal_to<std::type_index>,std::allocator<std::pair<std::type_index_const,std::any>>>
                  *)this;
      local_98 = item;
      local_90 = uVar14;
      local_88 = uVar18;
      local_80 = sVar6;
      local_78 = uVar13;
      local_70 = tVar12._M_target;
      local_68 = ppVar8;
      local_60 = pgVar10;
      local_58 = uVar21;
      uStack_57 = uVar22;
      uStack_56 = uVar23;
      uStack_55 = uVar24;
      uStack_54 = uVar25;
      uStack_53 = uVar26;
      uStack_52 = uVar27;
      uStack_51 = uVar28;
      uStack_50 = uVar29;
      uStack_4f = uVar30;
      uStack_4e = uVar31;
      uStack_4d = uVar32;
      uStack_4c = uVar33;
      uStack_4b = uVar34;
      uStack_4a = uVar35;
      uStack_49 = uVar36;
      do {
        uVar3 = 0;
        if (uVar7 != 0) {
          for (; (uVar7 >> uVar3 & 1) == 0; uVar3 = uVar3 + 1) {
          }
        }
        __s2 = *(pointer_____offset_0x10___ *)
                (ppVar8[uVar14 * 0xf + (ulong)uVar3].first._M_target + 8);
        if (__s1 == __s2) {
          bVar19 = true;
        }
        else if (*__s1 == '*') {
          bVar19 = false;
        }
        else {
          iVar5 = strcmp(__s1,__s2);
          bVar19 = iVar5 == 0;
          uVar21 = local_58;
          uVar22 = uStack_57;
          uVar23 = uStack_56;
          uVar24 = uStack_55;
          uVar25 = uStack_54;
          uVar26 = uStack_53;
          uVar27 = uStack_52;
          uVar28 = uStack_51;
          uVar29 = uStack_50;
          uVar30 = uStack_4f;
          uVar31 = uStack_4e;
          uVar32 = uStack_4d;
          uVar33 = uStack_4c;
          uVar34 = uStack_4b;
          uVar35 = uStack_4a;
          uVar36 = uStack_49;
        }
        item = local_98;
        uVar15 = local_b0;
        uVar16 = local_a8;
        this = (Bag *)local_a0;
        if (bVar19) {
          ppVar8 = ppVar8 + uVar14 * 0xf + (ulong)uVar3;
          goto LAB_00146262;
        }
        uVar7 = uVar7 - 1 & uVar7;
        ppVar9 = local_68;
        pgVar10 = local_60;
        uVar11 = local_90;
        tVar12._M_target = local_70;
        uVar13 = local_78;
        sVar6 = local_80;
        uVar17 = local_88;
      } while (uVar7 != 0);
    }
    if ((pgVar10[uVar14].m[0xf].n &
        (&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
          is_not_overflowed(unsigned_long)::shift)[uVar13]) == 0) break;
    uVar18 = uVar17 + 1;
    uVar14 = uVar11 + uVar17 + 1 & sVar6;
    ppVar8 = ppVar9;
  } while (uVar18 <= sVar6);
  ppVar8 = (value_type_pointer)0x0;
LAB_00146262:
  if (ppVar8 == (value_type_pointer)0x0) {
    if (*(ulong *)((long)this + 0x28) < *(ulong *)((long)this + 0x20)) {
      boost::unordered::detail::foa::
      table_core<boost::unordered::detail::foa::flat_map_types<std::type_index,std::any>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::type_index,void>,std::equal_to<std::type_index>,std::allocator<std::pair<std::type_index_const,std::any>>>
      ::
      nosize_unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,std::type_index>
                (&local_48,
                 (table_core<boost::unordered::detail::foa::flat_map_types<std::type_index,std::any>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::type_index,void>,std::equal_to<std::type_index>,std::allocator<std::pair<std::type_index_const,std::any>>>
                  *)this,(arrays_type *)this,uVar15,uVar16,&local_b9,&local_b8);
      *(long *)((long)this + 0x28) = *(long *)((long)this + 0x28) + 1;
      ppVar8 = local_48.p;
    }
    else {
      boost::unordered::detail::foa::
      table_core<boost::unordered::detail::foa::flat_map_types<std::type_index,std::any>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::type_index,void>,std::equal_to<std::type_index>,std::allocator<std::pair<std::type_index_const,std::any>>>
      ::
      unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,std::type_index>
                (&local_48,
                 (table_core<boost::unordered::detail::foa::flat_map_types<std::type_index,std::any>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::type_index,void>,std::equal_to<std::type_index>,std::allocator<std::pair<std::type_index_const,std::any>>>
                  *)this,uVar16,&local_b9,&local_b8);
      ppVar8 = local_48.p;
    }
  }
  std::any::operator=(&ppVar8->second,item);
  return;
}

Assistant:

void set(T&& item) {
        items[SLANG_TYPEOF(T)] = std::forward<T>(item);
    }